

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O3

Span<const_MILBlob::UInt1,_18446744073709551615UL> __thiscall
MILBlob::Blob::StorageReader::Impl::GetDataViewForSubByteSized<MILBlob::UInt1>
          (Impl *this,uint64_t offset)

{
  runtime_error *this_00;
  SpanSize<18446744073709551615UL> numElements;
  Span<const_unsigned_char,_18446744073709551615UL> SVar1;
  Span<const_MILBlob::UInt1,_18446744073709551615UL> SVar2;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  blob_metadata metadata;
  blob_metadata local_50;
  
  GetAndCheckMetadata(&local_50,this,offset,UInt1);
  SVar1 = MMapFileReader::ReadData
                    ((this->m_reader)._M_t.
                     super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                     .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                     _M_head_impl,local_50.offset,local_50.sizeInBytes);
  if (local_50.padding_size_in_bits < 8) {
    numElements.m_size = local_50.sizeInBytes * 8 - local_50.padding_size_in_bits;
    span.m_size.m_size = numElements.m_size;
    span.m_ptr = (pointer)SVar1.m_size.m_size.m_size;
    SVar2 = Util::CastToBitSpan<const_MILBlob::UInt1,_const_unsigned_char,_true>
                      ((Util *)SVar1.m_ptr,span,numElements.m_size);
    return SVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"8 or more bits of padding for sub-byte sized data is incorrect");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Util::Span<const T> GetDataViewForSubByteSized(uint64_t offset) const
    {
        auto metadata = GetAndCheckMetadata(offset, BlobDataTypeTraits<T>::DataType);

        Util::Span<const uint8_t> rawSpan = m_reader->ReadData(metadata.offset, metadata.sizeInBytes);

        MILVerifyIsTrue(metadata.padding_size_in_bits < 8,
                        std::runtime_error,
                        "8 or more bits of padding for sub-byte sized data is incorrect");

        if constexpr (MILBlob::SubByteIsByteAligned<T>()) {
            MILVerifyIsTrue(metadata.padding_size_in_bits % T::SizeInBits == 0,
                            std::runtime_error,
                            "Invalid padding for byte-aligned sub-byte-sized type");
        }

        // metadata.sizeInBytes includes the padding to make the data byte aligned

        size_t numBits = metadata.sizeInBytes * 8;
        numBits -= metadata.padding_size_in_bits;
        MILVerifyIsTrue(numBits % T::SizeInBits == 0, std::runtime_error, "Invalid padding for blob");
        size_t numElements = numBits / T::SizeInBits;

        return Util::CastToBitSpan<const T>(rawSpan, numElements);
    }